

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_cfg.cpp
# Opt level: O3

void __thiscall MppDecCfgService::MppDecCfgService(MppDecCfgService *this)

{
  MPP_RET MVar1;
  RK_S32 RVar2;
  MppCfgInfo tmp;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  
  this->mTrie = (MppTrie)0x0;
  MVar1 = mpp_trie_init(&this->mTrie,"MppDecCfg");
  if (MVar1 != MPP_OK) {
    _mpp_log_l(2,"mpp_dec_cfg","failed to init dec cfg set trie\n","MppDecCfgService");
    return;
  }
  local_38 = 1;
  uStack_30 = 0x800000001;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:type",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0xc00000002;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:coding",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x1000000004;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:hw_type",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x1400000008;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:batch_mode",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x1800000100;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:out_fmt",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x1c00000200;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:fast_out",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x2000000400;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:fast_parse",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x2400000800;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:split_parse",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x2800001000;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:internal_pts",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x2c00002000;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:sort_pts",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x3000004000;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:disable_error",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x3400008000;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:enable_vproc",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x3800010000;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:enable_fast_play",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x3c00020000;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:enable_hdr_meta",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x4000040000;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:enable_thumbnail",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x4400080000;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:enable_mvc",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x4800100000;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:disable_dpb_chk",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x4c10000000;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:disable_thread",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x5020000000;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:codec_mode",&local_38,0x14);
  local_38 = 1;
  uStack_30 = 0x5440000000;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"base:dis_err_clr_mark",&local_38,0x14);
  local_38 = 0x6800000005;
  uStack_30 = 0x7000000001;
  local_28 = 8;
  mpp_trie_add_info(this->mTrie,"cb:pkt_rdy_cb",&local_38,0x14);
  local_38 = 0x6800000005;
  uStack_30 = 0x7800000001;
  local_28 = 8;
  mpp_trie_add_info(this->mTrie,"cb:pkt_rdy_ctx",&local_38,0x14);
  local_38 = 0x6800000000;
  uStack_30 = 0x8000000001;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"cb:pkt_rdy_cmd",&local_38,0x14);
  local_38 = 0x6800000005;
  uStack_30 = 0x8800000002;
  local_28 = 8;
  mpp_trie_add_info(this->mTrie,"cb:frm_rdy_cb",&local_38,0x14);
  local_38 = 0x6800000005;
  uStack_30 = 0x9000000002;
  local_28 = 8;
  mpp_trie_add_info(this->mTrie,"cb:frm_rdy_ctx",&local_38,0x14);
  local_38 = 0x6800000000;
  uStack_30 = 0x9800000002;
  local_28 = 4;
  mpp_trie_add_info(this->mTrie,"cb:frm_rdy_cmd",&local_38,0x14);
  mpp_trie_add_info(this->mTrie,(char *)0x0,(void *)0x0,0);
  RVar2 = mpp_trie_get_node_count(this->mTrie);
  (this->mHead).node_count = RVar2;
  RVar2 = mpp_trie_get_info_count(this->mTrie);
  (this->mHead).info_count = RVar2;
  RVar2 = mpp_trie_get_buf_size(this->mTrie);
  (this->mHead).info_size = RVar2;
  if (((byte)mpp_dec_cfg_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_dec_cfg","node cnt: %d\n","MppDecCfgService",
               (ulong)(uint)(this->mHead).node_count);
  }
  return;
}

Assistant:

MppDecCfgService::MppDecCfgService() :
    mTrie(NULL)
{
    MPP_RET ret = mpp_trie_init(&mTrie, "MppDecCfg");
    if (ret) {
        mpp_err_f("failed to init dec cfg set trie\n");
        return ;
    }

    ENTRY_TABLE(EXPAND_AS_TRIE)

    mpp_trie_add_info(mTrie, NULL, NULL, 0);

    mHead.node_count = mpp_trie_get_node_count(mTrie);
    mHead.info_count = mpp_trie_get_info_count(mTrie);
    mHead.info_size = mpp_trie_get_buf_size(mTrie);

    mpp_dec_cfg_dbg_func("node cnt: %d\n", mHead.node_count);
}